

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Scene *pSVar7;
  Ref<embree::Geometry> *pRVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  ulong *puVar61;
  AABBNodeMB4D *node1;
  ulong uVar62;
  long lVar63;
  long lVar64;
  uint uVar65;
  ulong uVar66;
  int iVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  long lVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar94 [16];
  float fVar97;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar122 [32];
  float fVar129;
  float fVar131;
  uint uVar132;
  float fVar133;
  uint uVar134;
  float fVar135;
  float fVar136;
  uint uVar137;
  float fVar138;
  uint uVar139;
  float fVar140;
  uint uVar141;
  float fVar142;
  uint uVar143;
  undefined1 auVar130 [32];
  uint uVar144;
  float fVar145;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar146 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar147 [32];
  float fVar157;
  undefined1 auVar158 [32];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar159 [64];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_d90;
  float local_d70;
  float fStack_d6c;
  float fStack_d68;
  float fStack_d64;
  float local_d60;
  float fStack_d5c;
  float fStack_d58;
  float fStack_d54;
  undefined1 local_d50 [16];
  undefined1 (*local_d38) [16];
  ulong *local_d30;
  ulong local_d28;
  ulong local_d20;
  long local_d18;
  long local_d10;
  ulong local_d08;
  ulong local_d00;
  ulong local_cf8;
  long local_cf0;
  ulong local_ce8;
  ulong local_ce0;
  ulong local_cd8;
  ulong local_cd0;
  ulong local_cc8;
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [8];
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  undefined4 uStack_c84;
  undefined1 local_c80 [8];
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  undefined4 uStack_c64;
  undefined1 local_c60 [32];
  RTCFilterFunctionNArguments local_c40;
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  float local_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float local_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [8];
  float fStack_b88;
  float fStack_b84;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined1 local_b70 [8];
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  undefined1 local_b50 [8];
  float fStack_b48;
  float fStack_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  undefined1 local_b30 [8];
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [16];
  RTCHitN local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined4 local_ac0;
  undefined4 uStack_abc;
  undefined4 uStack_ab8;
  undefined4 uStack_ab4;
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  uint local_a80;
  uint uStack_a7c;
  uint uStack_a78;
  uint uStack_a74;
  uint uStack_a70;
  uint uStack_a6c;
  uint uStack_a68;
  uint uStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  undefined4 uStack_a44;
  undefined1 local_a40 [32];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined4 uStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_ba0._4_4_ = uVar3;
  local_ba0._0_4_ = uVar3;
  local_ba0._8_4_ = uVar3;
  local_ba0._12_4_ = uVar3;
  auVar116 = ZEXT1664(local_ba0);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_bb0._4_4_ = uVar3;
  local_bb0._0_4_ = uVar3;
  local_bb0._8_4_ = uVar3;
  local_bb0._12_4_ = uVar3;
  auVar118 = ZEXT1664(local_bb0);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_bc0._4_4_ = uVar3;
  local_bc0._0_4_ = uVar3;
  local_bc0._8_4_ = uVar3;
  local_bc0._12_4_ = uVar3;
  auVar120 = ZEXT1664(local_bc0);
  fVar78 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar88 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar89 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar69 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar66 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar77 = uVar69 ^ 0x10;
  uVar75 = uVar73 ^ 0x10;
  iVar67 = (tray->tnear).field_0.i[k];
  local_c00._4_4_ = iVar67;
  local_c00._0_4_ = iVar67;
  local_c00._8_4_ = iVar67;
  local_c00._12_4_ = iVar67;
  auVar159 = ZEXT1664(local_c00);
  local_a40._16_16_ = mm_lookupmask_ps._240_16_;
  local_a40._0_16_ = mm_lookupmask_ps._0_16_;
  iVar67 = (tray->tfar).field_0.i[k];
  local_c10._4_4_ = iVar67;
  local_c10._0_4_ = iVar67;
  local_c10._8_4_ = iVar67;
  local_c10._12_4_ = iVar67;
  auVar167 = ZEXT1664(local_c10);
  local_d38 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar102._8_4_ = 0x3f800000;
  auVar102._0_8_ = 0x3f8000003f800000;
  auVar102._12_4_ = 0x3f800000;
  auVar102._16_4_ = 0x3f800000;
  auVar102._20_4_ = 0x3f800000;
  auVar102._24_4_ = 0x3f800000;
  auVar102._28_4_ = 0x3f800000;
  auVar84._8_4_ = 0xbf800000;
  auVar84._0_8_ = 0xbf800000bf800000;
  auVar84._12_4_ = 0xbf800000;
  auVar84._16_4_ = 0xbf800000;
  auVar84._20_4_ = 0xbf800000;
  auVar84._24_4_ = 0xbf800000;
  auVar84._28_4_ = 0xbf800000;
  _local_a60 = vblendvps_avx(auVar102,auVar84,local_a40);
  puVar61 = local_7f8;
  fVar90 = fVar78;
  fVar91 = fVar78;
  fVar92 = fVar78;
  fVar93 = fVar88;
  fVar97 = fVar88;
  fVar135 = fVar88;
  fVar148 = fVar89;
  fVar150 = fVar89;
  fVar152 = fVar89;
  local_d28 = uVar73;
  local_d20 = uVar69;
  local_bf0 = fVar89;
  fStack_bec = fVar89;
  fStack_be8 = fVar89;
  fStack_be4 = fVar89;
  local_be0 = fVar88;
  fStack_bdc = fVar88;
  fStack_bd8 = fVar88;
  fStack_bd4 = fVar88;
  local_bd0 = fVar78;
  fStack_bcc = fVar78;
  fStack_bc8 = fVar78;
  fStack_bc4 = fVar78;
LAB_00f09242:
  do {
    local_d30 = puVar61;
    if (local_d30 == &local_800) {
LAB_00f09f6c:
      return local_d30 != &local_800;
    }
    local_d90 = local_d30 + -1;
    uVar76 = local_d30[-1];
    while ((uVar76 & 8) == 0) {
      uVar62 = uVar76 & 0xfffffffffffffff0;
      fVar4 = *(float *)(ray + k * 4 + 0x70);
      auVar79._4_4_ = fVar4;
      auVar79._0_4_ = fVar4;
      auVar79._8_4_ = fVar4;
      auVar79._12_4_ = fVar4;
      pfVar2 = (float *)(uVar62 + 0x80 + uVar69);
      pfVar1 = (float *)(uVar62 + 0x20 + uVar69);
      auVar80._0_4_ = fVar4 * *pfVar2 + *pfVar1;
      auVar80._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
      auVar80._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
      auVar80._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
      auVar80 = vsubps_avx(auVar80,auVar116._0_16_);
      auVar82._0_4_ = fVar78 * auVar80._0_4_;
      auVar82._4_4_ = fVar90 * auVar80._4_4_;
      auVar82._8_4_ = fVar91 * auVar80._8_4_;
      auVar82._12_4_ = fVar92 * auVar80._12_4_;
      pfVar2 = (float *)(uVar62 + 0x80 + uVar73);
      auVar80 = vmaxps_avx(auVar159._0_16_,auVar82);
      pfVar1 = (float *)(uVar62 + 0x20 + uVar73);
      auVar83._0_4_ = fVar4 * *pfVar2 + *pfVar1;
      auVar83._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
      auVar83._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
      auVar83._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
      auVar82 = vsubps_avx(auVar83,auVar118._0_16_);
      pfVar2 = (float *)(uVar62 + 0x80 + uVar66);
      pfVar1 = (float *)(uVar62 + 0x20 + uVar66);
      auVar106._0_4_ = fVar4 * *pfVar2 + *pfVar1;
      auVar106._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
      auVar106._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
      auVar106._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
      auVar98._0_4_ = fVar88 * auVar82._0_4_;
      auVar98._4_4_ = fVar93 * auVar82._4_4_;
      auVar98._8_4_ = fVar97 * auVar82._8_4_;
      auVar98._12_4_ = fVar135 * auVar82._12_4_;
      auVar82 = vsubps_avx(auVar106,auVar120._0_16_);
      auVar107._0_4_ = fVar89 * auVar82._0_4_;
      auVar107._4_4_ = fVar148 * auVar82._4_4_;
      auVar107._8_4_ = fVar150 * auVar82._8_4_;
      auVar107._12_4_ = fVar152 * auVar82._12_4_;
      auVar82 = vmaxps_avx(auVar98,auVar107);
      pfVar2 = (float *)(uVar62 + 0x80 + uVar77);
      pfVar1 = (float *)(uVar62 + 0x20 + uVar77);
      auVar108._0_4_ = fVar4 * *pfVar2 + *pfVar1;
      auVar108._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
      auVar108._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
      auVar108._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
      auVar80 = vmaxps_avx(auVar80,auVar82);
      auVar82 = vsubps_avx(auVar108,auVar116._0_16_);
      auVar99._0_4_ = fVar78 * auVar82._0_4_;
      auVar99._4_4_ = fVar90 * auVar82._4_4_;
      auVar99._8_4_ = fVar91 * auVar82._8_4_;
      auVar99._12_4_ = fVar92 * auVar82._12_4_;
      auVar82 = vminps_avx(auVar167._0_16_,auVar99);
      pfVar2 = (float *)(uVar62 + 0x80 + uVar75);
      pfVar1 = (float *)(uVar62 + 0x20 + uVar75);
      auVar109._0_4_ = fVar4 * *pfVar2 + *pfVar1;
      auVar109._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
      auVar109._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
      auVar109._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
      auVar83 = vsubps_avx(auVar109,auVar118._0_16_);
      auVar110._0_4_ = fVar88 * auVar83._0_4_;
      auVar110._4_4_ = fVar93 * auVar83._4_4_;
      auVar110._8_4_ = fVar97 * auVar83._8_4_;
      auVar110._12_4_ = fVar135 * auVar83._12_4_;
      pfVar2 = (float *)(uVar62 + 0x80 + (uVar66 ^ 0x10));
      pfVar1 = (float *)(uVar62 + 0x20 + (uVar66 ^ 0x10));
      auVar111._0_4_ = fVar4 * *pfVar2 + *pfVar1;
      auVar111._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
      auVar111._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
      auVar111._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
      auVar83 = vsubps_avx(auVar111,auVar120._0_16_);
      auVar112._0_4_ = fVar89 * auVar83._0_4_;
      auVar112._4_4_ = fVar148 * auVar83._4_4_;
      auVar112._8_4_ = fVar150 * auVar83._8_4_;
      auVar112._12_4_ = fVar152 * auVar83._12_4_;
      auVar83 = vminps_avx(auVar110,auVar112);
      auVar82 = vminps_avx(auVar82,auVar83);
      if (((uint)uVar76 & 7) == 6) {
        auVar82 = vcmpps_avx(auVar80,auVar82,2);
        auVar80 = vcmpps_avx(*(undefined1 (*) [16])(uVar62 + 0xe0),auVar79,2);
        auVar83 = vcmpps_avx(auVar79,*(undefined1 (*) [16])(uVar62 + 0xf0),1);
        auVar80 = vandps_avx(auVar80,auVar83);
        auVar80 = vandps_avx(auVar80,auVar82);
      }
      else {
        auVar80 = vcmpps_avx(auVar80,auVar82,2);
      }
      auVar80 = vpslld_avx(auVar80,0x1f);
      uVar65 = vmovmskps_avx(auVar80);
      puVar61 = local_d90;
      if (uVar65 == 0) goto LAB_00f09242;
      uVar65 = uVar65 & 0xff;
      lVar13 = 0;
      if (uVar65 != 0) {
        for (; (uVar65 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      uVar76 = *(ulong *)(uVar62 + lVar13 * 8);
      uVar65 = uVar65 - 1 & uVar65;
      uVar68 = (ulong)uVar65;
      if (uVar65 != 0) {
        do {
          *local_d90 = uVar76;
          local_d90 = local_d90 + 1;
          lVar13 = 0;
          if (uVar68 != 0) {
            for (; (uVar68 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          uVar76 = *(ulong *)(uVar62 + lVar13 * 8);
          uVar68 = uVar68 - 1 & uVar68;
        } while (uVar68 != 0);
      }
    }
    local_d18 = (ulong)((uint)uVar76 & 0xf) - 8;
    uVar76 = uVar76 & 0xfffffffffffffff0;
    for (local_d10 = 0; puVar61 = local_d90, local_d10 != local_d18; local_d10 = local_d10 + 1) {
      lVar63 = local_d10 * 0x60;
      pSVar7 = context->scene;
      pRVar8 = (pSVar7->geometries).items;
      pGVar9 = pRVar8[*(uint *)(uVar76 + 0x40 + lVar63)].ptr;
      fVar78 = (pGVar9->time_range).lower;
      fVar78 = pGVar9->fnumTimeSegments *
               ((*(float *)(ray + k * 4 + 0x70) - fVar78) / ((pGVar9->time_range).upper - fVar78));
      auVar80 = vroundss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78),9);
      auVar80 = vminss_avx(auVar80,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar112 = vmaxss_avx(ZEXT816(0) << 0x20,auVar80);
      iVar67 = (int)auVar112._0_4_;
      lVar71 = (long)iVar67 * 0x38;
      lVar13 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar71);
      local_ce0 = (ulong)*(uint *)(uVar76 + 4 + lVar63);
      auVar80 = *(undefined1 (*) [16])(lVar13 + (ulong)*(uint *)(uVar76 + lVar63) * 4);
      uVar73 = (ulong)*(uint *)(uVar76 + 0x10 + lVar63);
      auVar82 = *(undefined1 (*) [16])(lVar13 + uVar73 * 4);
      uVar62 = (ulong)*(uint *)(uVar76 + 0x20 + lVar63);
      auVar83 = *(undefined1 (*) [16])(lVar13 + uVar62 * 4);
      uVar68 = (ulong)*(uint *)(uVar76 + 0x30 + lVar63);
      auVar79 = *(undefined1 (*) [16])(lVar13 + uVar68 * 4);
      local_cf0 = *(long *)&pRVar8[*(uint *)(uVar76 + 0x44 + lVar63)].ptr[2].numPrimitives;
      lVar13 = *(long *)(local_cf0 + lVar71);
      auVar98 = *(undefined1 (*) [16])(lVar13 + local_ce0 * 4);
      local_cd0 = (ulong)*(uint *)(uVar76 + 0x14 + lVar63);
      auVar99 = *(undefined1 (*) [16])(lVar13 + local_cd0 * 4);
      local_cc8 = (ulong)*(uint *)(uVar76 + 0x24 + lVar63);
      auVar106 = *(undefined1 (*) [16])(lVar13 + local_cc8 * 4);
      uVar70 = (ulong)*(uint *)(uVar76 + 0x34 + lVar63);
      auVar107 = *(undefined1 (*) [16])(lVar13 + uVar70 * 4);
      lVar13 = *(long *)&pRVar8[*(uint *)(uVar76 + 0x48 + lVar63)].ptr[2].numPrimitives;
      lVar10 = *(long *)(lVar13 + lVar71);
      uVar74 = (ulong)*(uint *)(uVar76 + 8 + lVar63);
      auVar108 = *(undefined1 (*) [16])(lVar10 + uVar74 * 4);
      local_cf8 = (ulong)*(uint *)(uVar76 + 0x18 + lVar63);
      auVar109 = *(undefined1 (*) [16])(lVar10 + local_cf8 * 4);
      local_ce8 = (ulong)*(uint *)(uVar76 + 0x28 + lVar63);
      auVar110 = *(undefined1 (*) [16])(lVar10 + local_ce8 * 4);
      local_cd8 = (ulong)*(uint *)(uVar76 + 0x38 + lVar63);
      auVar111 = *(undefined1 (*) [16])(lVar10 + local_cd8 * 4);
      fVar78 = fVar78 - auVar112._0_4_;
      local_b00 = ZEXT416((uint)fVar78);
      lVar10 = *(long *)&pRVar8[*(uint *)(uVar76 + 0x4c + lVar63)].ptr[2].numPrimitives;
      lVar71 = *(long *)(lVar10 + lVar71);
      uVar69 = (ulong)*(uint *)(uVar76 + 0xc + lVar63);
      auVar112 = *(undefined1 (*) [16])(lVar71 + uVar69 * 4);
      local_d08 = (ulong)*(uint *)(uVar76 + 0x1c + lVar63);
      auVar81 = *(undefined1 (*) [16])(lVar71 + local_d08 * 4);
      auVar113 = vunpcklps_avx(auVar80,auVar108);
      auVar108 = vunpckhps_avx(auVar80,auVar108);
      auVar114 = vunpcklps_avx(auVar98,auVar112);
      auVar98 = vunpckhps_avx(auVar98,auVar112);
      uVar72 = (ulong)*(uint *)(uVar76 + 0x2c + lVar63);
      auVar80 = *(undefined1 (*) [16])(lVar71 + uVar72 * 4);
      _local_b20 = vunpcklps_avx(auVar108,auVar98);
      _local_b60 = vunpcklps_avx(auVar113,auVar114);
      _local_b40 = vunpckhps_avx(auVar113,auVar114);
      auVar108 = vunpcklps_avx(auVar82,auVar109);
      auVar98 = vunpckhps_avx(auVar82,auVar109);
      auVar109 = vunpcklps_avx(auVar99,auVar81);
      auVar99 = vunpckhps_avx(auVar99,auVar81);
      local_d00 = (ulong)*(uint *)(uVar76 + 0x3c + lVar63);
      auVar82 = *(undefined1 (*) [16])(lVar71 + local_d00 * 4);
      _local_b10 = vunpcklps_avx(auVar98,auVar99);
      _local_b50 = vunpcklps_avx(auVar108,auVar109);
      _local_b30 = vunpckhps_avx(auVar108,auVar109);
      auVar99 = vunpcklps_avx(auVar83,auVar110);
      auVar83 = vunpckhps_avx(auVar83,auVar110);
      auVar108 = vunpcklps_avx(auVar106,auVar80);
      auVar98 = vunpckhps_avx(auVar106,auVar80);
      lVar64 = (long)(iVar67 + 1) * 0x38;
      lVar71 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar64);
      auVar80 = *(undefined1 (*) [16])(lVar71 + (ulong)*(uint *)(uVar76 + lVar63) * 4);
      auVar106 = vunpcklps_avx(auVar83,auVar98);
      _local_b90 = vunpcklps_avx(auVar99,auVar108);
      _local_b80 = vunpckhps_avx(auVar99,auVar108);
      auVar98 = vunpcklps_avx(auVar79,auVar111);
      auVar83 = vunpckhps_avx(auVar79,auVar111);
      auVar99 = vunpcklps_avx(auVar107,auVar82);
      auVar79 = vunpckhps_avx(auVar107,auVar82);
      lVar13 = *(long *)(lVar13 + lVar64);
      auVar82 = *(undefined1 (*) [16])(lVar13 + uVar74 * 4);
      auVar107 = vunpcklps_avx(auVar83,auVar79);
      auVar108 = vunpcklps_avx(auVar98,auVar99);
      _local_b70 = vunpckhps_avx(auVar98,auVar99);
      lVar11 = *(long *)(local_cf0 + lVar64);
      auVar79 = vunpcklps_avx(auVar80,auVar82);
      auVar83 = vunpckhps_avx(auVar80,auVar82);
      auVar80 = *(undefined1 (*) [16])(lVar11 + local_ce0 * 4);
      lVar10 = *(long *)(lVar10 + lVar64);
      auVar82 = *(undefined1 (*) [16])(lVar10 + uVar69 * 4);
      auVar98 = vunpcklps_avx(auVar80,auVar82);
      auVar80 = vunpckhps_avx(auVar80,auVar82);
      auVar109 = vunpcklps_avx(auVar83,auVar80);
      auVar110 = vunpcklps_avx(auVar79,auVar98);
      auVar83 = vunpckhps_avx(auVar79,auVar98);
      auVar80 = *(undefined1 (*) [16])(lVar71 + uVar73 * 4);
      auVar82 = *(undefined1 (*) [16])(lVar13 + local_cf8 * 4);
      auVar98 = vunpcklps_avx(auVar80,auVar82);
      auVar79 = vunpckhps_avx(auVar80,auVar82);
      auVar80 = *(undefined1 (*) [16])(lVar11 + local_cd0 * 4);
      auVar82 = *(undefined1 (*) [16])(lVar10 + local_d08 * 4);
      auVar99 = vunpcklps_avx(auVar80,auVar82);
      auVar80 = vunpckhps_avx(auVar80,auVar82);
      auVar111 = vunpcklps_avx(auVar79,auVar80);
      auVar112 = vunpcklps_avx(auVar98,auVar99);
      auVar79 = vunpckhps_avx(auVar98,auVar99);
      auVar80 = *(undefined1 (*) [16])(lVar71 + uVar62 * 4);
      auVar82 = *(undefined1 (*) [16])(lVar13 + local_ce8 * 4);
      auVar99 = vunpcklps_avx(auVar80,auVar82);
      auVar98 = vunpckhps_avx(auVar80,auVar82);
      auVar80 = *(undefined1 (*) [16])(lVar11 + local_cc8 * 4);
      auVar82 = *(undefined1 (*) [16])(lVar10 + uVar72 * 4);
      auVar81 = vunpcklps_avx(auVar80,auVar82);
      auVar80 = vunpckhps_avx(auVar80,auVar82);
      auVar113 = vunpcklps_avx(auVar98,auVar80);
      auVar114 = vunpcklps_avx(auVar99,auVar81);
      auVar98 = vunpckhps_avx(auVar99,auVar81);
      auVar80 = *(undefined1 (*) [16])(lVar71 + uVar68 * 4);
      auVar82 = *(undefined1 (*) [16])(lVar13 + local_cd8 * 4);
      auVar81 = vunpcklps_avx(auVar80,auVar82);
      auVar99 = vunpckhps_avx(auVar80,auVar82);
      auVar80 = *(undefined1 (*) [16])(lVar11 + uVar70 * 4);
      auVar82 = *(undefined1 (*) [16])(lVar10 + local_d00 * 4);
      auVar100 = vunpcklps_avx(auVar80,auVar82);
      auVar80 = vunpckhps_avx(auVar80,auVar82);
      auVar101 = vunpcklps_avx(auVar99,auVar80);
      auVar94 = vunpcklps_avx(auVar81,auVar100);
      auVar99 = vunpckhps_avx(auVar81,auVar100);
      auVar80 = vshufps_avx(local_b00,local_b00,0);
      auVar82 = ZEXT416((uint)(1.0 - fVar78));
      auVar82 = vshufps_avx(auVar82,auVar82,0);
      fVar78 = auVar80._0_4_;
      fVar88 = auVar80._4_4_;
      fVar89 = auVar80._8_4_;
      fVar90 = auVar80._12_4_;
      fVar91 = auVar82._0_4_;
      fVar92 = auVar82._4_4_;
      fVar93 = auVar82._8_4_;
      fVar97 = auVar82._12_4_;
      auVar117._4_4_ = fVar92 * (float)local_b60._4_4_ + auVar110._4_4_ * fVar88;
      auVar117._0_4_ = fVar91 * (float)local_b60._0_4_ + auVar110._0_4_ * fVar78;
      auVar117._8_4_ = fVar93 * fStack_b58 + auVar110._8_4_ * fVar89;
      auVar117._12_4_ = fVar97 * fStack_b54 + auVar110._12_4_ * fVar90;
      auVar119._0_4_ = fVar91 * (float)local_b40._0_4_ + fVar78 * auVar83._0_4_;
      auVar119._4_4_ = fVar92 * (float)local_b40._4_4_ + fVar88 * auVar83._4_4_;
      auVar119._8_4_ = fVar93 * fStack_b38 + fVar89 * auVar83._8_4_;
      auVar119._12_4_ = fVar97 * fStack_b34 + fVar90 * auVar83._12_4_;
      auVar122._4_4_ = fVar92 * (float)local_b20._4_4_ + auVar109._4_4_ * fVar88;
      auVar122._0_4_ = fVar91 * (float)local_b20._0_4_ + auVar109._0_4_ * fVar78;
      auVar122._8_4_ = fVar93 * fStack_b18 + auVar109._8_4_ * fVar89;
      auVar122._12_4_ = fVar97 * fStack_b14 + auVar109._12_4_ * fVar90;
      auVar146._0_4_ = fVar91 * (float)local_b50._0_4_ + fVar78 * auVar112._0_4_;
      auVar146._4_4_ = fVar92 * (float)local_b50._4_4_ + fVar88 * auVar112._4_4_;
      auVar146._8_4_ = fVar93 * fStack_b48 + fVar89 * auVar112._8_4_;
      auVar146._12_4_ = fVar97 * fStack_b44 + fVar90 * auVar112._12_4_;
      auVar100._0_4_ = fVar91 * (float)local_b30._0_4_ + auVar79._0_4_ * fVar78;
      auVar100._4_4_ = fVar92 * (float)local_b30._4_4_ + auVar79._4_4_ * fVar88;
      auVar100._8_4_ = fVar93 * fStack_b28 + auVar79._8_4_ * fVar89;
      auVar100._12_4_ = fVar97 * fStack_b24 + auVar79._12_4_ * fVar90;
      auVar169._0_4_ = fVar91 * (float)local_b10._0_4_ + auVar111._0_4_ * fVar78;
      auVar169._4_4_ = fVar92 * (float)local_b10._4_4_ + auVar111._4_4_ * fVar88;
      auVar169._8_4_ = fVar93 * fStack_b08 + auVar111._8_4_ * fVar89;
      auVar169._12_4_ = fVar97 * fStack_b04 + auVar111._12_4_ * fVar90;
      auVar117._20_4_ = fVar92 * (float)local_b90._4_4_ + fVar88 * auVar114._4_4_;
      auVar117._16_4_ = fVar91 * (float)local_b90._0_4_ + fVar78 * auVar114._0_4_;
      auVar117._24_4_ = fVar93 * fStack_b88 + fVar89 * auVar114._8_4_;
      auVar117._28_4_ = fVar97 * fStack_b84 + fVar90 * auVar114._12_4_;
      auVar119._20_4_ = fVar92 * (float)local_b80._4_4_ + auVar98._4_4_ * fVar88;
      auVar119._16_4_ = fVar91 * (float)local_b80._0_4_ + auVar98._0_4_ * fVar78;
      auVar119._24_4_ = fVar93 * fStack_b78 + auVar98._8_4_ * fVar89;
      auVar119._28_4_ = fVar97 * fStack_b74 + auVar98._12_4_ * fVar90;
      local_d60 = auVar106._0_4_;
      fStack_d5c = auVar106._4_4_;
      fStack_d58 = auVar106._8_4_;
      fStack_d54 = auVar106._12_4_;
      auVar122._20_4_ = fVar92 * fStack_d5c + auVar113._4_4_ * fVar88;
      auVar122._16_4_ = fVar91 * local_d60 + auVar113._0_4_ * fVar78;
      auVar122._24_4_ = fVar93 * fStack_d58 + auVar113._8_4_ * fVar89;
      auVar122._28_4_ = fVar97 * fStack_d54 + auVar113._12_4_ * fVar90;
      lVar13 = uVar76 + 0x40 + lVar63;
      local_a00 = *(undefined8 *)(lVar13 + 0x10);
      uStack_9f8 = *(undefined8 *)(lVar13 + 0x18);
      auVar113._0_4_ = auVar108._0_4_ * fVar91 + fVar78 * auVar94._0_4_;
      auVar113._4_4_ = auVar108._4_4_ * fVar92 + fVar88 * auVar94._4_4_;
      auVar113._8_4_ = auVar108._8_4_ * fVar93 + fVar89 * auVar94._8_4_;
      auVar113._12_4_ = auVar108._12_4_ * fVar97 + fVar90 * auVar94._12_4_;
      uStack_9f0 = local_a00;
      uStack_9e8 = uStack_9f8;
      lVar63 = uVar76 + 0x50 + lVar63;
      local_a20 = *(undefined8 *)(lVar63 + 0x10);
      uStack_a18 = *(undefined8 *)(lVar63 + 0x18);
      auVar114._0_4_ = fVar91 * (float)local_b70._0_4_ + fVar78 * auVar99._0_4_;
      auVar114._4_4_ = fVar92 * (float)local_b70._4_4_ + fVar88 * auVar99._4_4_;
      auVar114._8_4_ = fVar93 * fStack_b68 + fVar89 * auVar99._8_4_;
      auVar114._12_4_ = fVar97 * fStack_b64 + fVar90 * auVar99._12_4_;
      local_d70 = auVar107._0_4_;
      fStack_d6c = auVar107._4_4_;
      fStack_d68 = auVar107._8_4_;
      fStack_d64 = auVar107._12_4_;
      auVar81._0_4_ = fVar91 * local_d70 + fVar78 * auVar101._0_4_;
      auVar81._4_4_ = fVar92 * fStack_d6c + fVar88 * auVar101._4_4_;
      auVar81._8_4_ = fVar93 * fStack_d68 + fVar89 * auVar101._8_4_;
      auVar81._12_4_ = fVar97 * fStack_d64 + fVar90 * auVar101._12_4_;
      uStack_a10 = local_a20;
      uStack_a08 = uStack_a18;
      auVar95._16_16_ = auVar146;
      auVar95._0_16_ = auVar146;
      auVar103._16_16_ = auVar100;
      auVar103._0_16_ = auVar100;
      auVar130._16_16_ = auVar169;
      auVar130._0_16_ = auVar169;
      auVar147._16_16_ = auVar113;
      auVar147._0_16_ = auVar113;
      auVar158._16_16_ = auVar114;
      auVar158._0_16_ = auVar114;
      auVar85._16_16_ = auVar81;
      auVar85._0_16_ = auVar81;
      auVar84 = vsubps_avx(auVar117,auVar95);
      auVar102 = vsubps_avx(auVar119,auVar103);
      auVar46 = vsubps_avx(auVar122,auVar130);
      auVar87 = vsubps_avx(auVar147,auVar117);
      auVar95 = vsubps_avx(auVar158,auVar119);
      auVar85 = vsubps_avx(auVar85,auVar122);
      fVar90 = auVar102._0_4_;
      fVar157 = auVar85._0_4_;
      fVar148 = auVar102._4_4_;
      fVar160 = auVar85._4_4_;
      auVar47._4_4_ = fVar160 * fVar148;
      auVar47._0_4_ = fVar157 * fVar90;
      fVar16 = auVar102._8_4_;
      fVar161 = auVar85._8_4_;
      auVar47._8_4_ = fVar161 * fVar16;
      fVar22 = auVar102._12_4_;
      fVar162 = auVar85._12_4_;
      auVar47._12_4_ = fVar162 * fVar22;
      fVar28 = auVar102._16_4_;
      fVar163 = auVar85._16_4_;
      auVar47._16_4_ = fVar163 * fVar28;
      fVar34 = auVar102._20_4_;
      fVar164 = auVar85._20_4_;
      auVar47._20_4_ = fVar164 * fVar34;
      fVar40 = auVar102._24_4_;
      fVar165 = auVar85._24_4_;
      auVar47._24_4_ = fVar165 * fVar40;
      auVar47._28_4_ = auVar81._12_4_;
      fVar91 = auVar46._0_4_;
      fVar145 = auVar95._0_4_;
      fVar150 = auVar46._4_4_;
      fVar149 = auVar95._4_4_;
      auVar48._4_4_ = fVar149 * fVar150;
      auVar48._0_4_ = fVar145 * fVar91;
      fVar17 = auVar46._8_4_;
      fVar151 = auVar95._8_4_;
      auVar48._8_4_ = fVar151 * fVar17;
      fVar23 = auVar46._12_4_;
      fVar153 = auVar95._12_4_;
      auVar48._12_4_ = fVar153 * fVar23;
      fVar29 = auVar46._16_4_;
      fVar154 = auVar95._16_4_;
      auVar48._16_4_ = fVar154 * fVar29;
      fVar35 = auVar46._20_4_;
      fVar155 = auVar95._20_4_;
      auVar48._20_4_ = fVar155 * fVar35;
      fVar41 = auVar46._24_4_;
      fVar156 = auVar95._24_4_;
      auVar48._24_4_ = fVar156 * fVar41;
      auVar48._28_4_ = auVar146._12_4_;
      _local_c80 = vsubps_avx(auVar48,auVar47);
      fVar129 = auVar87._0_4_;
      fVar131 = auVar87._4_4_;
      auVar46._4_4_ = fVar131 * fVar150;
      auVar46._0_4_ = fVar129 * fVar91;
      fVar133 = auVar87._8_4_;
      auVar46._8_4_ = fVar133 * fVar17;
      fVar136 = auVar87._12_4_;
      auVar46._12_4_ = fVar136 * fVar23;
      fVar138 = auVar87._16_4_;
      auVar46._16_4_ = fVar138 * fVar29;
      fVar140 = auVar87._20_4_;
      auVar46._20_4_ = fVar140 * fVar35;
      fVar142 = auVar87._24_4_;
      auVar46._24_4_ = fVar142 * fVar41;
      auVar46._28_4_ = auVar146._12_4_;
      fVar92 = auVar84._0_4_;
      fVar152 = auVar84._4_4_;
      auVar49._4_4_ = fVar160 * fVar152;
      auVar49._0_4_ = fVar157 * fVar92;
      fVar18 = auVar84._8_4_;
      auVar49._8_4_ = fVar161 * fVar18;
      fVar24 = auVar84._12_4_;
      auVar49._12_4_ = fVar162 * fVar24;
      fVar30 = auVar84._16_4_;
      auVar49._16_4_ = fVar163 * fVar30;
      fVar36 = auVar84._20_4_;
      auVar49._20_4_ = fVar164 * fVar36;
      fVar42 = auVar84._24_4_;
      auVar49._24_4_ = fVar165 * fVar42;
      auVar49._28_4_ = auVar100._12_4_;
      _local_ca0 = vsubps_avx(auVar49,auVar46);
      auVar50._4_4_ = fVar149 * fVar152;
      auVar50._0_4_ = fVar145 * fVar92;
      auVar50._8_4_ = fVar151 * fVar18;
      auVar50._12_4_ = fVar153 * fVar24;
      auVar50._16_4_ = fVar154 * fVar30;
      auVar50._20_4_ = fVar155 * fVar36;
      auVar50._24_4_ = fVar156 * fVar42;
      auVar50._28_4_ = auVar100._12_4_;
      auVar166._0_4_ = fVar129 * fVar90;
      auVar166._4_4_ = fVar131 * fVar148;
      auVar166._8_4_ = fVar133 * fVar16;
      auVar166._12_4_ = fVar136 * fVar22;
      auVar166._16_4_ = fVar138 * fVar28;
      auVar166._20_4_ = fVar140 * fVar34;
      auVar166._24_4_ = fVar142 * fVar40;
      auVar166._28_4_ = 0;
      uVar3 = *(undefined4 *)(ray + k * 4);
      auVar168._4_4_ = uVar3;
      auVar168._0_4_ = uVar3;
      auVar168._8_4_ = uVar3;
      auVar168._12_4_ = uVar3;
      auVar168._16_4_ = uVar3;
      auVar168._20_4_ = uVar3;
      auVar168._24_4_ = uVar3;
      auVar168._28_4_ = uVar3;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar170._4_4_ = uVar5;
      auVar170._0_4_ = uVar5;
      auVar170._8_4_ = uVar5;
      auVar170._12_4_ = uVar5;
      auVar170._16_4_ = uVar5;
      auVar170._20_4_ = uVar5;
      auVar170._24_4_ = uVar5;
      auVar170._28_4_ = uVar5;
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar171._4_4_ = uVar6;
      auVar171._0_4_ = uVar6;
      auVar171._8_4_ = uVar6;
      auVar171._12_4_ = uVar6;
      auVar171._16_4_ = uVar6;
      auVar171._20_4_ = uVar6;
      auVar171._24_4_ = uVar6;
      auVar171._28_4_ = uVar6;
      fVar78 = *(float *)(ray + k * 4 + 0x50);
      local_cc0 = vsubps_avx(auVar166,auVar50);
      auVar84 = vsubps_avx(auVar117,auVar168);
      fVar88 = *(float *)(ray + k * 4 + 0x60);
      auVar102 = vsubps_avx(auVar119,auVar170);
      auVar46 = vsubps_avx(auVar122,auVar171);
      fVar121 = auVar46._0_4_;
      fVar123 = auVar46._4_4_;
      auVar51._4_4_ = fVar123 * fVar78;
      auVar51._0_4_ = fVar121 * fVar78;
      fVar124 = auVar46._8_4_;
      auVar51._8_4_ = fVar124 * fVar78;
      fVar125 = auVar46._12_4_;
      auVar51._12_4_ = fVar125 * fVar78;
      fVar126 = auVar46._16_4_;
      auVar51._16_4_ = fVar126 * fVar78;
      fVar127 = auVar46._20_4_;
      auVar51._20_4_ = fVar127 * fVar78;
      fVar128 = auVar46._24_4_;
      auVar51._24_4_ = fVar128 * fVar78;
      auVar51._28_4_ = uVar3;
      fVar93 = auVar102._0_4_;
      fVar4 = auVar102._4_4_;
      auVar52._4_4_ = fVar88 * fVar4;
      auVar52._0_4_ = fVar88 * fVar93;
      fVar19 = auVar102._8_4_;
      auVar52._8_4_ = fVar88 * fVar19;
      fVar25 = auVar102._12_4_;
      auVar52._12_4_ = fVar88 * fVar25;
      fVar31 = auVar102._16_4_;
      auVar52._16_4_ = fVar88 * fVar31;
      fVar37 = auVar102._20_4_;
      auVar52._20_4_ = fVar88 * fVar37;
      fVar43 = auVar102._24_4_;
      auVar52._24_4_ = fVar88 * fVar43;
      auVar52._28_4_ = uVar5;
      auVar102 = vsubps_avx(auVar52,auVar51);
      fVar89 = *(float *)(ray + k * 4 + 0x40);
      fVar97 = auVar84._0_4_;
      fVar14 = auVar84._4_4_;
      auVar53._4_4_ = fVar88 * fVar14;
      auVar53._0_4_ = fVar88 * fVar97;
      fVar20 = auVar84._8_4_;
      auVar53._8_4_ = fVar88 * fVar20;
      fVar26 = auVar84._12_4_;
      auVar53._12_4_ = fVar88 * fVar26;
      fVar32 = auVar84._16_4_;
      auVar53._16_4_ = fVar88 * fVar32;
      fVar38 = auVar84._20_4_;
      auVar53._20_4_ = fVar88 * fVar38;
      fVar44 = auVar84._24_4_;
      auVar53._24_4_ = fVar88 * fVar44;
      auVar53._28_4_ = uVar6;
      auVar54._4_4_ = fVar123 * fVar89;
      auVar54._0_4_ = fVar121 * fVar89;
      auVar54._8_4_ = fVar124 * fVar89;
      auVar54._12_4_ = fVar125 * fVar89;
      auVar54._16_4_ = fVar126 * fVar89;
      auVar54._20_4_ = fVar127 * fVar89;
      auVar54._24_4_ = fVar128 * fVar89;
      auVar54._28_4_ = auVar146._12_4_;
      auVar46 = vsubps_avx(auVar54,auVar53);
      auVar55._4_4_ = fVar89 * fVar4;
      auVar55._0_4_ = fVar89 * fVar93;
      auVar55._8_4_ = fVar89 * fVar19;
      auVar55._12_4_ = fVar89 * fVar25;
      auVar55._16_4_ = fVar89 * fVar31;
      auVar55._20_4_ = fVar89 * fVar37;
      auVar55._24_4_ = fVar89 * fVar43;
      auVar55._28_4_ = uVar6;
      auVar56._4_4_ = fVar14 * fVar78;
      auVar56._0_4_ = fVar97 * fVar78;
      auVar56._8_4_ = fVar20 * fVar78;
      auVar56._12_4_ = fVar26 * fVar78;
      auVar56._16_4_ = fVar32 * fVar78;
      auVar56._20_4_ = fVar38 * fVar78;
      auVar56._24_4_ = fVar44 * fVar78;
      auVar56._28_4_ = auVar100._12_4_;
      auVar47 = vsubps_avx(auVar56,auVar55);
      fVar135 = local_cc0._0_4_;
      fVar15 = local_cc0._4_4_;
      fVar21 = local_cc0._8_4_;
      fVar27 = local_cc0._12_4_;
      fVar33 = local_cc0._16_4_;
      fVar39 = local_cc0._20_4_;
      fVar45 = local_cc0._24_4_;
      auVar86._0_4_ =
           fVar89 * (float)local_c80._0_4_ + fVar88 * fVar135 + (float)local_ca0._0_4_ * fVar78;
      auVar86._4_4_ =
           fVar89 * (float)local_c80._4_4_ + fVar88 * fVar15 + (float)local_ca0._4_4_ * fVar78;
      auVar86._8_4_ = fVar89 * fStack_c78 + fVar88 * fVar21 + fStack_c98 * fVar78;
      auVar86._12_4_ = fVar89 * fStack_c74 + fVar88 * fVar27 + fStack_c94 * fVar78;
      auVar86._16_4_ = fVar89 * fStack_c70 + fVar88 * fVar33 + fStack_c90 * fVar78;
      auVar86._20_4_ = fVar89 * fStack_c6c + fVar88 * fVar39 + fStack_c8c * fVar78;
      auVar86._24_4_ = fVar89 * fStack_c68 + fVar88 * fVar45 + fStack_c88 * fVar78;
      auVar86._28_4_ = fVar88 + fVar88 + fVar78;
      auVar104._8_4_ = 0x80000000;
      auVar104._0_8_ = 0x8000000080000000;
      auVar104._12_4_ = 0x80000000;
      auVar104._16_4_ = 0x80000000;
      auVar104._20_4_ = 0x80000000;
      auVar104._24_4_ = 0x80000000;
      auVar104._28_4_ = 0x80000000;
      auVar84 = vandps_avx(auVar86,auVar104);
      uVar65 = auVar84._0_4_;
      local_9e0._0_4_ =
           (float)(uVar65 ^ (uint)(fVar129 * auVar102._0_4_ +
                                  fVar157 * auVar47._0_4_ + fVar145 * auVar46._0_4_));
      uVar132 = auVar84._4_4_;
      local_9e0._4_4_ =
           (float)(uVar132 ^
                  (uint)(fVar131 * auVar102._4_4_ +
                        fVar160 * auVar47._4_4_ + fVar149 * auVar46._4_4_));
      uVar134 = auVar84._8_4_;
      local_9e0._8_4_ =
           (float)(uVar134 ^
                  (uint)(fVar133 * auVar102._8_4_ +
                        fVar161 * auVar47._8_4_ + fVar151 * auVar46._8_4_));
      uVar137 = auVar84._12_4_;
      local_9e0._12_4_ =
           (float)(uVar137 ^
                  (uint)(fVar136 * auVar102._12_4_ +
                        fVar162 * auVar47._12_4_ + fVar153 * auVar46._12_4_));
      uVar139 = auVar84._16_4_;
      local_9e0._16_4_ =
           (float)(uVar139 ^
                  (uint)(fVar138 * auVar102._16_4_ +
                        fVar163 * auVar47._16_4_ + fVar154 * auVar46._16_4_));
      uVar141 = auVar84._20_4_;
      local_9e0._20_4_ =
           (float)(uVar141 ^
                  (uint)(fVar140 * auVar102._20_4_ +
                        fVar164 * auVar47._20_4_ + fVar155 * auVar46._20_4_));
      uVar143 = auVar84._24_4_;
      local_9e0._24_4_ =
           (float)(uVar143 ^
                  (uint)(fVar142 * auVar102._24_4_ +
                        fVar165 * auVar47._24_4_ + fVar156 * auVar46._24_4_));
      uVar144 = auVar84._28_4_;
      local_9e0._28_4_ = (float)(uVar144 ^ (uint)(auVar87._28_4_ + auVar85._28_4_ + auVar95._28_4_))
      ;
      local_9c0._0_4_ =
           (float)(uVar65 ^ (uint)(auVar102._0_4_ * fVar92 +
                                  fVar91 * auVar47._0_4_ + fVar90 * auVar46._0_4_));
      local_9c0._4_4_ =
           (float)(uVar132 ^
                  (uint)(auVar102._4_4_ * fVar152 +
                        fVar150 * auVar47._4_4_ + fVar148 * auVar46._4_4_));
      local_9c0._8_4_ =
           (float)(uVar134 ^
                  (uint)(auVar102._8_4_ * fVar18 + fVar17 * auVar47._8_4_ + fVar16 * auVar46._8_4_))
      ;
      local_9c0._12_4_ =
           (float)(uVar137 ^
                  (uint)(auVar102._12_4_ * fVar24 +
                        fVar23 * auVar47._12_4_ + fVar22 * auVar46._12_4_));
      local_9c0._16_4_ =
           (float)(uVar139 ^
                  (uint)(auVar102._16_4_ * fVar30 +
                        fVar29 * auVar47._16_4_ + fVar28 * auVar46._16_4_));
      local_9c0._20_4_ =
           (float)(uVar141 ^
                  (uint)(auVar102._20_4_ * fVar36 +
                        fVar35 * auVar47._20_4_ + fVar34 * auVar46._20_4_));
      local_9c0._24_4_ =
           (float)(uVar143 ^
                  (uint)(auVar102._24_4_ * fVar42 +
                        fVar41 * auVar47._24_4_ + fVar40 * auVar46._24_4_));
      local_9c0._28_4_ = (float)(uVar144 ^ (uint)(auVar47._28_4_ + auVar46._28_4_ + -0.0));
      auVar102 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar84 = vcmpps_avx(local_9e0,auVar102,5);
      auVar102 = vcmpps_avx(local_9c0,auVar102,5);
      auVar84 = vandps_avx(auVar84,auVar102);
      auVar105._8_4_ = 0x7fffffff;
      auVar105._0_8_ = 0x7fffffff7fffffff;
      auVar105._12_4_ = 0x7fffffff;
      auVar105._16_4_ = 0x7fffffff;
      auVar105._20_4_ = 0x7fffffff;
      auVar105._24_4_ = 0x7fffffff;
      auVar105._28_4_ = 0x7fffffff;
      local_980 = vandps_avx(auVar86,auVar105);
      auVar102 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar86,4);
      auVar84 = vandps_avx(auVar84,auVar102);
      auVar87._0_4_ = local_9e0._0_4_ + local_9c0._0_4_;
      auVar87._4_4_ = local_9e0._4_4_ + local_9c0._4_4_;
      auVar87._8_4_ = local_9e0._8_4_ + local_9c0._8_4_;
      auVar87._12_4_ = local_9e0._12_4_ + local_9c0._12_4_;
      auVar87._16_4_ = local_9e0._16_4_ + local_9c0._16_4_;
      auVar87._20_4_ = local_9e0._20_4_ + local_9c0._20_4_;
      auVar87._24_4_ = local_9e0._24_4_ + local_9c0._24_4_;
      auVar87._28_4_ = local_9e0._28_4_ + local_9c0._28_4_;
      auVar102 = vcmpps_avx(auVar87,local_980,2);
      auVar46 = auVar102 & auVar84;
      if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar46 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar46 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar46 >> 0x7f,0) != '\0') ||
            (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar46 >> 0xbf,0) != '\0') ||
          (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar46[0x1f] < '\0') {
        auVar84 = vandps_avx(auVar84,auVar102);
        auVar80 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
        local_9a0._0_4_ =
             (float)(uVar65 ^ (uint)((float)local_c80._0_4_ * fVar97 +
                                    (float)local_ca0._0_4_ * fVar93 + fVar121 * fVar135));
        local_9a0._4_4_ =
             (float)(uVar132 ^
                    (uint)((float)local_c80._4_4_ * fVar14 +
                          (float)local_ca0._4_4_ * fVar4 + fVar123 * fVar15));
        local_9a0._8_4_ =
             (float)(uVar134 ^ (uint)(fStack_c78 * fVar20 + fStack_c98 * fVar19 + fVar124 * fVar21))
        ;
        local_9a0._12_4_ =
             (float)(uVar137 ^ (uint)(fStack_c74 * fVar26 + fStack_c94 * fVar25 + fVar125 * fVar27))
        ;
        local_9a0._16_4_ =
             (float)(uVar139 ^ (uint)(fStack_c70 * fVar32 + fStack_c90 * fVar31 + fVar126 * fVar33))
        ;
        local_9a0._20_4_ =
             (float)(uVar141 ^ (uint)(fStack_c6c * fVar38 + fStack_c8c * fVar37 + fVar127 * fVar39))
        ;
        local_9a0._24_4_ =
             (float)(uVar143 ^ (uint)(fStack_c68 * fVar44 + fStack_c88 * fVar43 + fVar128 * fVar45))
        ;
        local_9a0._28_4_ = uVar144 ^ 0x7fc00000;
        fVar78 = *(float *)(ray + k * 4 + 0x30);
        fVar88 = local_980._0_4_;
        fVar89 = local_980._4_4_;
        auVar57._4_4_ = fVar89 * fVar78;
        auVar57._0_4_ = fVar88 * fVar78;
        fVar90 = local_980._8_4_;
        auVar57._8_4_ = fVar90 * fVar78;
        fVar91 = local_980._12_4_;
        auVar57._12_4_ = fVar91 * fVar78;
        fVar92 = local_980._16_4_;
        auVar57._16_4_ = fVar92 * fVar78;
        fVar93 = local_980._20_4_;
        auVar57._20_4_ = fVar93 * fVar78;
        fVar97 = local_980._24_4_;
        auVar57._24_4_ = fVar97 * fVar78;
        auVar57._28_4_ = fVar78;
        auVar84 = vcmpps_avx(auVar57,local_9a0,1);
        fVar78 = *(float *)(ray + k * 4 + 0x80);
        auVar116 = ZEXT3264(CONCAT428(fVar78,CONCAT424(fVar78,CONCAT420(fVar78,CONCAT416(fVar78,
                                                  CONCAT412(fVar78,CONCAT48(fVar78,CONCAT44(fVar78,
                                                  fVar78))))))));
        auVar58._4_4_ = fVar78 * fVar89;
        auVar58._0_4_ = fVar78 * fVar88;
        auVar58._8_4_ = fVar78 * fVar90;
        auVar58._12_4_ = fVar78 * fVar91;
        auVar58._16_4_ = fVar78 * fVar92;
        auVar58._20_4_ = fVar78 * fVar93;
        auVar58._24_4_ = fVar78 * fVar97;
        auVar58._28_4_ = 0x7fffffff;
        auVar102 = vcmpps_avx(local_9a0,auVar58,2);
        auVar84 = vandps_avx(auVar84,auVar102);
        auVar82 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
        auVar80 = vpand_avx(auVar82,auVar80);
        auVar82 = vpmovzxwd_avx(auVar80);
        auVar82 = vpslld_avx(auVar82,0x1f);
        auVar83 = vpsrad_avx(auVar82,0x1f);
        auVar82 = vpunpckhwd_avx(auVar80,auVar80);
        auVar82 = vpslld_avx(auVar82,0x1f);
        auVar82 = vpsrad_avx(auVar82,0x1f);
        local_900._16_16_ = auVar82;
        local_900._0_16_ = auVar83;
        if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_900 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_900 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_900 >> 0x7f,0) != '\0') ||
              (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar82 >> 0x3f,0) != '\0') ||
            (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar82[0xf] < '\0') {
          local_960 = (float)local_c80._0_4_;
          fStack_95c = (float)local_c80._4_4_;
          fStack_958 = fStack_c78;
          fStack_954 = fStack_c74;
          fStack_950 = fStack_c70;
          fStack_94c = fStack_c6c;
          fStack_948 = fStack_c68;
          uStack_944 = uStack_c64;
          local_940 = (float)local_ca0._0_4_;
          fStack_93c = (float)local_ca0._4_4_;
          fStack_938 = fStack_c98;
          fStack_934 = fStack_c94;
          fStack_930 = fStack_c90;
          fStack_92c = fStack_c8c;
          fStack_928 = fStack_c88;
          uStack_924 = uStack_c84;
          local_920 = local_cc0;
          local_820 = local_a40;
          auVar102 = vrcpps_avx(local_980);
          fVar78 = auVar102._0_4_;
          auVar96._0_4_ = fVar88 * fVar78;
          fVar88 = auVar102._4_4_;
          auVar96._4_4_ = fVar89 * fVar88;
          fVar89 = auVar102._8_4_;
          auVar96._8_4_ = fVar90 * fVar89;
          fVar90 = auVar102._12_4_;
          auVar96._12_4_ = fVar91 * fVar90;
          fVar91 = auVar102._16_4_;
          auVar96._16_4_ = fVar92 * fVar91;
          fVar92 = auVar102._20_4_;
          auVar96._20_4_ = fVar93 * fVar92;
          fVar93 = auVar102._24_4_;
          auVar96._24_4_ = fVar97 * fVar93;
          auVar96._28_4_ = 0;
          auVar115._8_4_ = 0x3f800000;
          auVar115._0_8_ = 0x3f8000003f800000;
          auVar115._12_4_ = 0x3f800000;
          auVar115._16_4_ = 0x3f800000;
          auVar115._20_4_ = 0x3f800000;
          auVar115._24_4_ = 0x3f800000;
          auVar115._28_4_ = 0x3f800000;
          auVar84 = vsubps_avx(auVar115,auVar96);
          fStack_884 = auVar84._28_4_;
          fVar78 = fVar78 + fVar78 * auVar84._0_4_;
          fVar88 = fVar88 + fVar88 * auVar84._4_4_;
          fVar89 = fVar89 + fVar89 * auVar84._8_4_;
          fVar90 = fVar90 + fVar90 * auVar84._12_4_;
          fVar91 = fVar91 + fVar91 * auVar84._16_4_;
          fVar92 = fVar92 + fVar92 * auVar84._20_4_;
          fVar93 = fVar93 + fVar93 * auVar84._24_4_;
          local_8a0[0] = fVar78 * local_9a0._0_4_;
          local_8a0[1] = fVar88 * local_9a0._4_4_;
          local_8a0[2] = fVar89 * local_9a0._8_4_;
          local_8a0[3] = fVar90 * local_9a0._12_4_;
          fStack_890 = fVar91 * local_9a0._16_4_;
          fStack_88c = fVar92 * local_9a0._20_4_;
          fStack_888 = fVar93 * local_9a0._24_4_;
          auVar59._4_4_ = fVar88 * local_9e0._4_4_;
          auVar59._0_4_ = fVar78 * local_9e0._0_4_;
          auVar59._8_4_ = fVar89 * local_9e0._8_4_;
          auVar59._12_4_ = fVar90 * local_9e0._12_4_;
          auVar59._16_4_ = fVar91 * local_9e0._16_4_;
          auVar59._20_4_ = fVar92 * local_9e0._20_4_;
          auVar59._24_4_ = fVar93 * local_9e0._24_4_;
          auVar59._28_4_ = fStack_884;
          auVar84 = vminps_avx(auVar59,auVar115);
          auVar60._4_4_ = fVar88 * local_9c0._4_4_;
          auVar60._0_4_ = fVar78 * local_9c0._0_4_;
          auVar60._8_4_ = fVar89 * local_9c0._8_4_;
          auVar60._12_4_ = fVar90 * local_9c0._12_4_;
          auVar60._16_4_ = fVar91 * local_9c0._16_4_;
          auVar60._20_4_ = fVar92 * local_9c0._20_4_;
          auVar60._24_4_ = fVar93 * local_9c0._24_4_;
          auVar60._28_4_ = auVar102._28_4_ + fStack_884;
          auVar102 = vminps_avx(auVar60,auVar115);
          auVar46 = vsubps_avx(auVar115,auVar84);
          auVar87 = vsubps_avx(auVar115,auVar102);
          local_8c0 = vblendvps_avx(auVar102,auVar46,local_a40);
          local_8e0 = vblendvps_avx(auVar84,auVar87,local_a40);
          local_860._4_4_ = (float)local_ca0._4_4_ * (float)local_a60._4_4_;
          local_860._0_4_ = (float)local_ca0._0_4_ * (float)local_a60._0_4_;
          local_860._8_4_ = fStack_c98 * fStack_a58;
          local_860._12_4_ = fStack_c94 * fStack_a54;
          local_860._16_4_ = fStack_c90 * fStack_a50;
          local_860._20_4_ = fStack_c8c * fStack_a4c;
          local_860._24_4_ = fStack_c88 * fStack_a48;
          local_860._28_4_ = local_8e0._28_4_;
          local_840._4_4_ = fVar15 * (float)local_a60._4_4_;
          local_840._0_4_ = fVar135 * (float)local_a60._0_4_;
          local_840._8_4_ = fVar21 * fStack_a58;
          local_840._12_4_ = fVar27 * fStack_a54;
          local_840._16_4_ = fVar33 * fStack_a50;
          local_840._20_4_ = fVar39 * fStack_a4c;
          local_840._24_4_ = fVar45 * fStack_a48;
          local_840._28_4_ = uStack_a44;
          local_880[0] = (float)local_c80._0_4_ * (float)local_a60._0_4_;
          local_880[1] = (float)local_c80._4_4_ * (float)local_a60._4_4_;
          local_880[2] = fStack_c78 * fStack_a58;
          local_880[3] = fStack_c74 * fStack_a54;
          fStack_870 = fStack_c70 * fStack_a50;
          fStack_86c = fStack_c6c * fStack_a4c;
          fStack_868 = fStack_c68 * fStack_a48;
          uStack_864 = local_8c0._28_4_;
          auVar80 = vpsllw_avx(auVar80,0xf);
          auVar80 = vpacksswb_avx(auVar80,auVar80);
          uVar69 = (ulong)(byte)(SUB161(auVar80 >> 7,0) & 1 | (SUB161(auVar80 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar80 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar80 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar80 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar80 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar80 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar80 >> 0x3f,0) << 7);
          do {
            uVar73 = 0;
            if (uVar69 != 0) {
              for (; (uVar69 >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
              }
            }
            uVar65 = *(uint *)((long)&local_a00 + uVar73 * 4);
            pGVar9 = (pSVar7->geometries).items[uVar65].ptr;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_c80 = (undefined1  [8])uVar69;
                local_c60 = auVar116._0_32_;
                local_ac0 = *(undefined4 *)(local_8e0 + uVar73 * 4);
                fVar78 = local_8a0[uVar73 - 8];
                local_ab0._4_4_ = fVar78;
                local_ab0._0_4_ = fVar78;
                local_ab0._8_4_ = fVar78;
                local_ab0._12_4_ = fVar78;
                *(float *)(ray + k * 4 + 0x80) = local_8a0[uVar73];
                local_c40.context = context->user;
                local_a90 = vpshufd_avx(ZEXT416(uVar65),0);
                uVar3 = *(undefined4 *)((long)&local_a20 + uVar73 * 4);
                local_aa0._4_4_ = uVar3;
                local_aa0._0_4_ = uVar3;
                local_aa0._8_4_ = uVar3;
                local_aa0._12_4_ = uVar3;
                fVar78 = local_880[uVar73];
                local_af0._4_4_ = fVar78;
                local_af0._0_4_ = fVar78;
                local_af0._8_4_ = fVar78;
                local_af0._12_4_ = fVar78;
                uVar3 = *(undefined4 *)(local_860 + uVar73 * 4);
                local_ae0._4_4_ = uVar3;
                local_ae0._0_4_ = uVar3;
                local_ae0._8_4_ = uVar3;
                local_ae0._12_4_ = uVar3;
                local_ca0 = (undefined1  [8])uVar73;
                uVar3 = *(undefined4 *)(local_840 + uVar73 * 4);
                local_ad0._4_4_ = uVar3;
                local_ad0._0_4_ = uVar3;
                local_ad0._8_4_ = uVar3;
                local_ad0._12_4_ = uVar3;
                vcmpps_avx(ZEXT1632(local_a90),ZEXT1632(local_a90),0xf);
                uStack_a7c = (local_c40.context)->instID[0];
                local_a80 = uStack_a7c;
                uStack_a78 = uStack_a7c;
                uStack_a74 = uStack_a7c;
                uStack_a70 = (local_c40.context)->instPrimID[0];
                uStack_a6c = uStack_a70;
                uStack_a68 = uStack_a70;
                uStack_a64 = uStack_a70;
                local_d50 = *local_d38;
                local_c40.valid = (int *)local_d50;
                local_c40.geometryUserPtr = pGVar9->userPtr;
                local_c40.hit = local_af0;
                local_c40.N = 4;
                local_cc0._0_8_ = pGVar9;
                local_c40.ray = (RTCRayN *)ray;
                uStack_abc = local_ac0;
                uStack_ab8 = local_ac0;
                uStack_ab4 = local_ac0;
                if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar9->occlusionFilterN)(&local_c40);
                }
                if (local_d50 == (undefined1  [16])0x0) {
                  auVar80 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar80 = auVar80 ^ _DAT_01f46b70;
                }
                else {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_cc0._0_8_ + 0x3e) & 0x40) != 0)))) {
                    (*p_Var12)(&local_c40);
                  }
                  auVar82 = vpcmpeqd_avx(local_d50,_DAT_01f45a50);
                  auVar80 = auVar82 ^ _DAT_01f46b70;
                  auVar101._8_4_ = 0xff800000;
                  auVar101._0_8_ = 0xff800000ff800000;
                  auVar101._12_4_ = 0xff800000;
                  auVar82 = vblendvps_avx(auVar101,*(undefined1 (*) [16])(local_c40.ray + 0x80),
                                          auVar82);
                  *(undefined1 (*) [16])(local_c40.ray + 0x80) = auVar82;
                }
                auVar94._8_8_ = 0x100000001;
                auVar94._0_8_ = 0x100000001;
                if ((auVar94 & auVar80) == (undefined1  [16])0x0) {
                  auVar116 = ZEXT3264(local_c60);
                  *(int *)(ray + k * 4 + 0x80) = local_c60._0_4_;
                  uVar69 = (ulong)local_c80 ^ 1L << ((ulong)local_ca0 & 0x3f);
                  goto LAB_00f09ee2;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_00f09f6c;
            }
            uVar69 = uVar69 ^ 1L << (uVar73 & 0x3f);
LAB_00f09ee2:
          } while (uVar69 != 0);
        }
      }
      auVar116 = ZEXT1664(local_ba0);
      auVar118 = ZEXT1664(local_bb0);
      auVar120 = ZEXT1664(local_bc0);
      auVar159 = ZEXT1664(local_c00);
      auVar167 = ZEXT1664(local_c10);
      uVar69 = local_d20;
      uVar73 = local_d28;
      fVar78 = local_bd0;
      fVar90 = fStack_bcc;
      fVar91 = fStack_bc8;
      fVar92 = fStack_bc4;
      fVar88 = local_be0;
      fVar93 = fStack_bdc;
      fVar97 = fStack_bd8;
      fVar135 = fStack_bd4;
      fVar89 = local_bf0;
      fVar148 = fStack_bec;
      fVar150 = fStack_be8;
      fVar152 = fStack_be4;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }